

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

TPZFMatrix<Fad<float>_> * __thiscall
TPZFMatrix<Fad<float>_>::operator*=(TPZFMatrix<Fad<float>_> *this,Fad<float> *value)

{
  int64_t iVar1;
  int64_t iVar2;
  Fad<float> *pFVar3;
  TPZFMatrix<Fad<float>_> *in_RDI;
  Fad<float> *in_stack_00000008;
  Fad<float> *in_stack_00000010;
  Fad<float> *dstlast;
  Fad<float> *dst;
  int64_t size;
  Fad<float> *local_20;
  
  iVar1 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RDI);
  iVar2 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RDI);
  local_20 = in_RDI->fElem;
  pFVar3 = local_20 + iVar1 * iVar2;
  while (local_20 < pFVar3) {
    local_20 = local_20 + 1;
    Fad<float>::operator*=<float,_nullptr>(in_stack_00000010,in_stack_00000008);
  }
  return in_RDI;
}

Assistant:

TPZFMatrix<TVar> &TPZFMatrix<TVar>::operator*=( const TVar value ) {
    int64_t size = ((int64_t)this->Rows()) * this->Cols();
    TVar * dst = fElem, *dstlast = dst+size;
    while ( dst < dstlast ) *dst++ *= value;
    return( *this );
}